

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_cast.hpp
# Opt level: O2

bool duckdb::TryCastWithOverflowCheckFloat<double,int>
               (double value,int *result,double min,double max)

{
  bool bVar1;
  double dVar2;
  
  bVar1 = Value::IsFinite<double>(value);
  if (bVar1) {
    bVar1 = false;
    if ((min <= value) && (bVar1 = false, value < max)) {
      dVar2 = nearbyint(value);
      *result = (int)dVar2;
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool TryCastWithOverflowCheckFloat(SRC value, T &result, SRC min, SRC max) {
	if (!Value::IsFinite<SRC>(value)) {
		return false;
	}
	if (!(value >= min && value < max)) {
		return false;
	}
	// PG FLOAT => INT casts use statistical rounding.
	result = static_cast<T>(std::nearbyint(value));
	return true;
}